

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O0

bool __thiscall ON_Bitmap::Read(ON_Bitmap *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int local_28;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_Bitmap *this_local;
  
  iStack_24 = 0;
  local_28 = 0;
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&stack0xffffffffffffffdc,&local_28)
  ;
  if (bVar1) {
    bVar1 = false;
    if (iStack_24 == 1) {
      ON_ModelComponent::ReadModelComponentAttributes(&this->super_ON_ModelComponent,_minor_version)
      ;
      bVar2 = ON_FileReference::Read(&this->m_file_reference,_minor_version);
      if (bVar2) {
        bVar1 = true;
      }
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    this_local._7_1_ = bVar1;
    if (!bVar2) {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Bitmap::Read(ON_BinaryArchive& archive)
{
  int major_version = 0;
  int minor_version = 0;
  if (!archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (1 != major_version)
      break;
    ON_ModelComponent::ReadModelComponentAttributes(archive);
    if (!m_file_reference.Read(archive))
      break;

    rc = true;
    break;
  }

  if (!archive.EndRead3dmChunk())
    rc = false;

  return rc;
}